

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void __thiscall Board::Board(Board *this,int color,GameBoard *gameBoard)

{
  long lVar1;
  int *piVar2;
  long lVar3;
  
  setFrame(this);
  piVar2 = gameBoard->gridInfo[color][1] + 1;
  for (lVar1 = 1; lVar1 != 0x15; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 10; lVar3 = lVar3 + 1) {
      if (piVar2[lVar3] != 0) {
        this->rows[lVar1] = this->rows[lVar1] | 1 << ((char)lVar3 + 1U & 0x1f);
        this->cols[lVar3 + 1] = this->cols[lVar3 + 1] | 1 << ((byte)lVar1 & 0x1f);
      }
    }
    piVar2 = piVar2 + 0xc;
  }
  return;
}

Assistant:

Board::Board(int color, const GameBoard &gameBoard){
    setFrame();
    for (int i = 1; i <= MAPHEIGHT; ++i)
        for (int j = 1; j <= MAPWIDTH; ++j)
            if (gameBoard.gridInfo[color][i][j]){
                rows[i] |= 1 << j;
                cols[j] |= 1 << i;
            }
}